

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellReissner4::EvaluateSectionPoint
          (ChElementShellReissner4 *this,double u,double v,ChVector<double> *point)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  pointer psVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  psVar5 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar6 = (psVar5->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar7 = psVar5[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar8 = psVar5[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar9 = psVar5[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar10 = (u + 1.0) * 0.25;
  dVar11 = (1.0 - u) * 0.25;
  dVar12 = dVar10 * (v + 1.0);
  dVar13 = dVar11 * (v + 1.0);
  dVar1 = *(double *)&peVar7->field_0x30;
  dVar2 = *(double *)&peVar6->field_0x30;
  dVar11 = dVar11 * (1.0 - v);
  dVar3 = *(double *)&peVar8->field_0x30;
  dVar10 = dVar10 * (1.0 - v);
  dVar4 = *(double *)&peVar9->field_0x30;
  dVar14 = *(double *)&peVar7->field_0x28;
  dVar15 = *(double *)&peVar8->field_0x28;
  dVar16 = *(double *)&peVar9->field_0x28;
  dVar17 = *(double *)&peVar6->field_0x28;
  point->m_data[0] =
       dVar12 * *(double *)((long)&peVar6->super_ChNodeFEAbase + 0x20) +
       dVar13 * *(double *)((long)&peVar7->super_ChNodeFEAbase + 0x20) +
       dVar11 * *(double *)((long)&peVar8->super_ChNodeFEAbase + 0x20) +
       dVar10 * *(double *)((long)&peVar9->super_ChNodeFEAbase + 0x20);
  point->m_data[1] = dVar12 * dVar17 + dVar13 * dVar14 + dVar11 * dVar15 + dVar10 * dVar16;
  point->m_data[2] = dVar12 * dVar2 + dVar13 * dVar1 + dVar11 * dVar3 + dVar10 * dVar4;
  return;
}

Assistant:

void ChElementShellReissner4::EvaluateSectionPoint(const double u,
                                                   const double v,
                                                   ChVector<>& point) {
    ShapeVector N;
    this->ShapeFunctions(N, u, v);

    const ChVector<>& pA = m_nodes[0]->GetPos();
    const ChVector<>& pB = m_nodes[1]->GetPos();
    const ChVector<>& pC = m_nodes[2]->GetPos();
    const ChVector<>& pD = m_nodes[3]->GetPos();

    point = N(0) * pA + N(1) * pB + N(2) * pC + N(3) * pD;
}